

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qicon.cpp
# Opt level: O2

void __thiscall
QPixmapIconEngine::paint
          (QPixmapIconEngine *this,QPainter *painter,QRect *rect,Mode mode,State state)

{
  qreal qVar1;
  QPaintDevice *this_00;
  long in_FS_OFFSET;
  undefined4 uVar2;
  QSize local_60;
  undefined1 local_58 [16];
  QExplicitlySharedDataPointer<QPlatformPixmap> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = QPainter::device(painter);
  if (this_00 == (QPaintDevice *)0x0) {
    qVar1 = QGuiApplication::devicePixelRatio(QCoreApplication::self);
    uVar2 = SUB84(qVar1,0);
  }
  else {
    qVar1 = QPaintDevice::devicePixelRatio(this_00);
    uVar2 = SUB84(qVar1,0);
  }
  local_48.d.ptr = (totally_ordered_wrapper<QPlatformPixmap_*>)&DAT_aaaaaaaaaaaaaaaa;
  local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_60 = QRect::size(rect);
  (*(this->super_QIconEngine)._vptr_QIconEngine[0xe])
            (uVar2,(QPixmap *)local_58,this,&local_60,(ulong)mode,state);
  QPainter::drawPixmap(painter,rect,(QPixmap *)local_58);
  QPixmap::~QPixmap((QPixmap *)local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPixmapIconEngine::paint(QPainter *painter, const QRect &rect, QIcon::Mode mode, QIcon::State state)
{
    auto paintDevice = painter->device();
    qreal dpr = paintDevice ? paintDevice->devicePixelRatio() : qApp->devicePixelRatio();
    QPixmap px = scaledPixmap(rect.size(), mode, state, dpr);
    painter->drawPixmap(rect, px);
}